

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

void __thiscall
wasm::SmallVector<wasm::HeapType,_10UL>::push_back
          (SmallVector<wasm::HeapType,_10UL> *this,HeapType *x)

{
  ulong uVar1;
  
  uVar1 = this->usedFixed;
  if (uVar1 < 10) {
    this->usedFixed = uVar1 + 1;
    (this->fixed)._M_elems[uVar1].id = x->id;
    return;
  }
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back(&this->flexible,x);
  return;
}

Assistant:

void push_back(const T& x) {
    if (usedFixed < N) {
      fixed[usedFixed++] = x;
    } else {
      flexible.push_back(x);
    }
  }